

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> * __thiscall
GLRParser::findParseOptions
          (set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
           *__return_storage_ptr__,GLRParser *this,string *inputChar,GLRState *currentState)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  bool bVar2;
  string *psVar3;
  Production *this_00;
  set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_> *this_01;
  reference ppGVar4;
  ParseOperation *pPVar5;
  GLRState *pGVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __type local_151;
  ParseOperation *local_120;
  GLRTransition *local_118;
  GLRTransition *stateTo;
  iterator __end1;
  iterator __begin1;
  set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_> *__range1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  iterator local_b8;
  size_type local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  allocator<char> local_89;
  string local_88;
  ParseOperation *local_68 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  GLRState *local_28;
  GLRState *currentState_local;
  string *inputChar_local;
  GLRParser *this_local;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  *parseOperations;
  
  local_29 = 0;
  local_28 = currentState;
  currentState_local = (GLRState *)inputChar;
  inputChar_local = (string *)this;
  this_local = (GLRParser *)__return_storage_ptr__;
  std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::set
            (__return_storage_ptr__);
  psVar3 = GLRState::getName_abi_cxx11_(local_28);
  startStateName_abi_cxx11_();
  _Var1 = std::operator==(psVar3,&local_50);
  pGVar6 = currentState_local;
  local_151 = false;
  if (_Var1) {
    psVar3 = GLRState::getName_abi_cxx11_(this->startState);
    local_151 = std::operator==(&pGVar6->name,psVar3);
  }
  std::__cxx11::string::~string((string *)&local_50);
  if (local_151 != false) {
    pPVar5 = (ParseOperation *)operator_new(0x18);
    this_00 = (Production *)operator_new(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"accept",&local_89);
    local_e0 = &local_d8;
    startStateName_abi_cxx11_();
    local_b8 = &local_d8;
    local_b0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_e1);
    __l._M_len = local_b0;
    __l._M_array = local_b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a8,__l,&local_e1);
    Production::Production(this_00,&local_88,&local_a8);
    ParseOperation::ParseOperation(pPVar5,this_00);
    local_68[0] = pPVar5;
    std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::
    insert(__return_storage_ptr__,local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_e1);
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
    do {
      local_1a0 = local_1a0 + -1;
      std::__cxx11::string::~string((string *)local_1a0);
    } while (local_1a0 != &local_d8);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  this_01 = GLRState::getStatesTo(local_28);
  __end1 = std::set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>::
           begin(this_01);
  stateTo = (GLRTransition *)
            std::set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>
            ::end(this_01);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&stateTo), bVar2) {
    ppGVar4 = std::_Rb_tree_const_iterator<GLRTransition_*>::operator*(&__end1);
    local_118 = *ppGVar4;
    psVar3 = GLRTransition::getLabel_abi_cxx11_(local_118);
    _Var1 = std::operator==(psVar3,&currentState_local->name);
    if (_Var1) {
      pPVar5 = (ParseOperation *)operator_new(0x18);
      pGVar6 = GLRTransition::getStateTo(local_118);
      ParseOperation::ParseOperation(pPVar5,pGVar6);
      local_120 = pPVar5;
      std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::
      insert(__return_storage_ptr__,&local_120);
    }
    std::_Rb_tree_const_iterator<GLRTransition_*>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

set<ParseOperation *>
GLRParser::findParseOptions(const std::string &inputChar, const GLRState *currentState) const {

    set<ParseOperation *> parseOperations;

    if (currentState->getName() == startStateName() && inputChar == startState->getName()) {
        parseOperations.insert(new ParseOperation(new Production("accept", {startStateName()})));
    }

    for (auto stateTo: currentState->getStatesTo()) {
        if (stateTo->getLabel() == inputChar) {
            parseOperations.insert(new ParseOperation(stateTo->getStateTo()));

//            if (stateTo->getStateTo()->isAccepting()) {
//                for (auto prod: stateTo->getStateTo()->getProductions()) {
//                    if (prod->getToP()[prod->getToP().size() - 1] == getMarker()) {
//                        parseOperations.insert(new ParseOperation(prod));
//                    }
//                }
//            }

        }
    }
    return parseOperations;
}